

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_draw.c
# Opt level: O2

void blur(guint8 *buf,int w,int h)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  byte *pbVar7;
  ulong uVar8;
  byte *pbVar9;
  guint8 *pgVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar6 = 0;
  uVar4 = (ulong)(w - 1U);
  if ((int)(w - 1U) < 1) {
    uVar4 = uVar6;
  }
  lVar3 = (long)w;
  uVar8 = 0;
  if (0 < h) {
    uVar8 = (ulong)(uint)h;
  }
  pgVar10 = buf + 1;
  for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
    iVar5 = (uint)buf[uVar6 * lVar3] * 2;
    for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
      bVar1 = pgVar10[uVar11 - 1];
      bVar2 = pgVar10[uVar11];
      pgVar10[uVar11 - 1] = (guint8)(iVar5 + (uint)bVar2 + (uint)bVar1 >> 2);
      iVar5 = (uint)bVar2 + (uint)bVar1;
    }
    pgVar10 = pgVar10 + lVar3;
  }
  uVar6 = 0;
  uVar4 = (ulong)(h - 1U);
  if ((int)(h - 1U) < 1) {
    uVar4 = uVar6;
  }
  pbVar7 = buf;
  uVar8 = (ulong)(uint)w;
  if (w < 1) {
    uVar8 = uVar6;
  }
  for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
    pbVar9 = pbVar7;
    uVar11 = uVar4;
    iVar5 = (uint)buf[uVar6] * 2;
    while (bVar12 = uVar11 != 0, uVar11 = uVar11 - 1, bVar12) {
      bVar1 = *pbVar9;
      bVar2 = pbVar9[lVar3];
      *pbVar9 = (byte)(iVar5 + (uint)bVar2 + (uint)bVar1 >> 2);
      pbVar9 = pbVar9 + lVar3;
      iVar5 = (uint)bVar2 + (uint)bVar1;
    }
    pbVar7 = pbVar7 + 1;
  }
  return;
}

Assistant:

static void blur(guint8 *buf, int w, int h) {
    int x, y;
    unsigned int osum, nsum;

    for (y = 0; y < h; ++y) {
        osum = 2 * buf[y * w];
        for (x = 0; x < w - 1; ++x) {
            nsum = buf[y * w + x] + buf[y * w + x + 1];
            buf[y * w + x] = (osum + nsum) >> 2;
            osum = nsum;
        }
    }

    for (x = 0; x < w; ++x) {
        osum = 2 * buf[x];
        for (y = 0; y < h - 1; ++y) {
            nsum = buf[y * w + x] + buf[(y + 1) * w + x];
            buf[y * w + x] = (osum + nsum) >> 2;
            osum = nsum;
        }
    }
}